

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

void amqp_device_do_work(AMQP_DEVICE_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 uVar4;
  undefined8 uVar3;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG p_Stack_90;
  int is_timed_out_2;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG p_Stack_68;
  int is_timed_out_1;
  LOGGER_LOG l_6;
  size_t number_of_messengers_started;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG p_Stack_40;
  int is_timed_out;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  tickcounter_ms_t current_time_ms;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  AMQP_DEVICE_HANDLE handle_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  l = (LOGGER_LOG)handle;
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    instance = (AMQP_DEVICE_INSTANCE_conflict *)xlogging_get_log_function();
    if (instance != (AMQP_DEVICE_INSTANCE_conflict *)0x0) {
      (*(code *)instance)(0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                          ,"amqp_device_do_work",0x3aa,1,
                          "Failed to perform amqp_device_do_work (handle is NULL)");
    }
  }
  else {
    current_time_ms = (tickcounter_ms_t)handle;
    if (handle->state == DEVICE_STATE_STOPPING) {
      iVar1 = tickcounter_get_current_ms(handle->tick_counter_handle,(tickcounter_ms_t *)&l_1);
      if (iVar1 == 0) {
        if ((*(ulong *)(current_time_ms + 0xb0) <
             (ulong)((long)l_1 - *(long *)(current_time_ms + 0xa8))) &&
           (iVar1 = internal_device_stop((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms),
           iVar1 != 0)) {
          l_3 = xlogging_get_log_function();
          if (l_3 != (LOGGER_LOG)0x0) {
            (*l_3)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                   ,"amqp_device_do_work",0x3be,1,"Failed stopping device \'%s\'",
                   **(undefined8 **)current_time_ms);
          }
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
        }
      }
      else {
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                 ,"amqp_device_do_work",0x3b7,1,
                 "Failed stopping device \'%s\' (could not get tickcounter time)",
                 **(undefined8 **)current_time_ms);
        }
        update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
      }
    }
    else if (handle->state == DEVICE_STATE_STARTING) {
      if (handle->config->authentication_mode == DEVICE_AUTH_MODE_CBS) {
        if (handle->auth_state == AUTHENTICATION_STATE_STOPPED) {
          iVar1 = authentication_start(handle->authentication_handle,handle->cbs_handle);
          if (iVar1 != 0) {
            p_Stack_40 = xlogging_get_log_function();
            if (p_Stack_40 != (LOGGER_LOG)0x0) {
              (*p_Stack_40)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                            ,"amqp_device_do_work",0x3cb,1,
                            "Device \'%s\' failed to be authenticated (authentication_start failed)"
                            ,**(undefined8 **)current_time_ms);
            }
            update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_AUTH);
          }
        }
        else if (handle->auth_state == AUTHENTICATION_STATE_STARTING) {
          iVar1 = is_timeout_reached(handle->auth_state_last_changed_time,
                                     handle->auth_state_change_timeout_secs,(int *)((long)&l_4 + 4))
          ;
          if (iVar1 == 0) {
            if (l_4._4_4_ == 1) {
              number_of_messengers_started = (size_t)xlogging_get_log_function();
              if ((LOGGER_LOG)number_of_messengers_started != (LOGGER_LOG)0x0) {
                (*(code *)number_of_messengers_started)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                           ,"amqp_device_do_work",0x3da,1,
                           "Device \'%s\' authentication did not complete starting within expected timeout (%lu)"
                           ,**(undefined8 **)current_time_ms,*(undefined8 *)(current_time_ms + 0x38)
                          );
              }
              update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,
                           DEVICE_STATE_ERROR_AUTH_TIMEOUT);
            }
          }
          else {
            l_5 = xlogging_get_log_function();
            if (l_5 != (LOGGER_LOG)0x0) {
              (*l_5)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                     ,"amqp_device_do_work",0x3d5,1,
                     "Device \'%s\' failed verifying the timeout for authentication start (is_timeout_reached failed)"
                     ,**(undefined8 **)current_time_ms);
            }
            update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_AUTH);
          }
        }
        else if (handle->auth_state == AUTHENTICATION_STATE_ERROR) {
          if (handle->auth_error_code == AUTHENTICATION_ERROR_AUTH_FAILED) {
            update_state(handle,DEVICE_STATE_ERROR_AUTH);
          }
          else {
            update_state(handle,DEVICE_STATE_ERROR_AUTH_TIMEOUT);
          }
        }
      }
      if ((*(int *)(*(long *)current_time_ms + 0x28) == 1) ||
         (*(int *)(current_time_ms + 0x28) == 2)) {
        l_6 = (LOGGER_LOG)0x0;
        if (*(int *)(current_time_ms + 0x48) == 3) {
          iVar1 = telemetry_messenger_start
                            (*(TELEMETRY_MESSENGER_HANDLE *)(current_time_ms + 0x40),
                             *(SESSION_HANDLE *)(current_time_ms + 0x10));
          if (iVar1 != 0) {
            p_Stack_68 = xlogging_get_log_function();
            if (p_Stack_68 != (LOGGER_LOG)0x0) {
              (*p_Stack_68)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                            ,"amqp_device_do_work",0x3f5,1,
                            "Device \'%s\' messenger failed to be started (messenger_start failed)",
                            **(undefined8 **)current_time_ms);
            }
            update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
          }
        }
        else if (*(int *)(current_time_ms + 0x48) == 0) {
          iVar1 = is_timeout_reached(*(time_t *)(current_time_ms + 0x50),
                                     *(size_t *)(current_time_ms + 0x58),(int *)((long)&l_7 + 4));
          if (iVar1 == 0) {
            if (l_7._4_4_ == 1) {
              l_9 = xlogging_get_log_function();
              if (l_9 != (LOGGER_LOG)0x0) {
                (*l_9)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                       ,"amqp_device_do_work",0x405,1,
                       "Device \'%s\' messenger did not complete starting within expected timeout (%lu)"
                       ,**(undefined8 **)current_time_ms,*(undefined8 *)(current_time_ms + 0x58));
              }
              update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
            }
          }
          else {
            l_8 = xlogging_get_log_function();
            if (l_8 != (LOGGER_LOG)0x0) {
              (*l_8)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                     ,"amqp_device_do_work",0x3ff,1,
                     "Device \'%s\' failed verifying the timeout for messenger start (is_timeout_reached failed)"
                     ,**(undefined8 **)current_time_ms);
            }
            update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
          }
        }
        else if (*(int *)(current_time_ms + 0x48) == 4) {
          l_10 = xlogging_get_log_function();
          if (l_10 != (LOGGER_LOG)0x0) {
            (*l_10)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"amqp_device_do_work",0x40c,1,
                    "Device \'%s\' messenger failed to be started (messenger got into error state)",
                    **(undefined8 **)current_time_ms);
          }
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
        }
        else {
          l_6 = (LOGGER_LOG)(ulong)(*(int *)(current_time_ms + 0x48) == 1);
        }
        if (*(int *)(current_time_ms + 0x78) == 3) {
          iVar1 = twin_messenger_start
                            (*(TWIN_MESSENGER_HANDLE *)(current_time_ms + 0x70),
                             *(SESSION_HANDLE *)(current_time_ms + 0x10));
          if (iVar1 != 0) {
            p_Stack_90 = xlogging_get_log_function();
            if (p_Stack_90 != (LOGGER_LOG)0x0) {
              (*p_Stack_90)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                            ,"amqp_device_do_work",0x419,1,
                            "Device \'%s\' twin messenger failed to be started (messenger_start failed)"
                            ,**(undefined8 **)current_time_ms);
            }
            update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
          }
        }
        else if (*(int *)(current_time_ms + 0x78) == 0) {
          iVar1 = is_timeout_reached(*(time_t *)(current_time_ms + 0x80),
                                     *(size_t *)(current_time_ms + 0x88),(int *)((long)&l_11 + 4));
          if (iVar1 == 0) {
            if (l_11._4_4_ == 1) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                          ,"amqp_device_do_work",0x429,1,
                          "Device \'%s\' twin messenger did not complete starting within expected timeout (%lu)"
                          ,**(undefined8 **)current_time_ms,*(undefined8 *)(current_time_ms + 0x88))
                ;
              }
              update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                        ,"amqp_device_do_work",0x423,1,
                        "Device \'%s\' failed verifying the timeout for twin messenger start (is_timeout_reached failed)"
                        ,**(undefined8 **)current_time_ms);
            }
            update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
          }
        }
        else if (*(int *)(current_time_ms + 0x78) == 4) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                      ,"amqp_device_do_work",0x430,1,
                      "Device \'%s\' twin messenger failed to be started (messenger got into error state)"
                      ,**(undefined8 **)current_time_ms);
          }
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
        }
        else if (*(int *)(current_time_ms + 0x78) == 1) {
          l_6 = l_6 + 1;
        }
        if (l_6 == (LOGGER_LOG)0x2) {
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_STARTED);
        }
      }
    }
    else if (handle->state == DEVICE_STATE_STARTED) {
      if ((handle->config->authentication_mode == DEVICE_AUTH_MODE_CBS) &&
         (handle->auth_state != AUTHENTICATION_STATE_STARTED)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"amqp_device_do_work",0x444,1,
                    "Device \'%s\' is started but authentication reported unexpected state %d",
                    **(undefined8 **)current_time_ms,
                    CONCAT44(uVar4,*(undefined4 *)(current_time_ms + 0x28)));
        }
        if (*(int *)(current_time_ms + 0x28) == 3) {
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_AUTH);
        }
        else if (*(int *)(current_time_ms + 0x2c) == 1) {
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_AUTH);
        }
        else {
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,
                       DEVICE_STATE_ERROR_AUTH_TIMEOUT);
        }
      }
      else {
        if (handle->msgr_state != TELEMETRY_MESSENGER_STATE_STARTED) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            uVar3 = CONCAT44(uVar4,*(undefined4 *)(current_time_ms + 0x48));
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                      ,"amqp_device_do_work",0x45a,1,
                      "Device \'%s\' is started but messenger reported unexpected state %d",
                      **(undefined8 **)current_time_ms,uVar3);
            uVar4 = (undefined4)((ulong)uVar3 >> 0x20);
          }
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
        }
        if (*(int *)(current_time_ms + 0x78) != 1) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                      ,"amqp_device_do_work",0x460,1,
                      "Device \'%s\' is started but TWIN messenger reported unexpected state %d",
                      **(undefined8 **)current_time_ms,
                      CONCAT44(uVar4,*(undefined4 *)(current_time_ms + 0x78)));
          }
          update_state((AMQP_DEVICE_INSTANCE_conflict *)current_time_ms,DEVICE_STATE_ERROR_MSG);
        }
      }
    }
    if (((*(int *)(*(long *)current_time_ms + 0x28) == 0) && (*(int *)(current_time_ms + 0x28) != 0)
        ) && (*(int *)(current_time_ms + 0x28) != 3)) {
      authentication_do_work(*(AUTHENTICATION_HANDLE *)(current_time_ms + 0x20));
    }
    if ((*(int *)(current_time_ms + 0x48) != 3) && (*(int *)(current_time_ms + 0x48) != 4)) {
      telemetry_messenger_do_work(*(TELEMETRY_MESSENGER_HANDLE *)(current_time_ms + 0x40));
    }
    if ((*(int *)(current_time_ms + 0x78) != 3) && (*(int *)(current_time_ms + 0x78) != 4)) {
      twin_messenger_do_work(*(TWIN_MESSENGER_HANDLE *)(current_time_ms + 0x70));
    }
  }
  return;
}

Assistant:

void amqp_device_do_work(AMQP_DEVICE_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("Failed to perform amqp_device_do_work (handle is NULL)");
    }
    else
    {
        // Cranking the state monster:
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

        if (instance->state == DEVICE_STATE_STOPPING)
        {
            tickcounter_ms_t current_time_ms;

            if (tickcounter_get_current_ms(instance->tick_counter_handle, &current_time_ms) != 0)
            {
                LogError("Failed stopping device '%s' (could not get tickcounter time)", instance->config->device_id);
                update_state(instance, DEVICE_STATE_ERROR_MSG);
            }
            else if ((current_time_ms - instance->last_stop_request_time) > instance->stop_delay_ms)
            {
                if (internal_device_stop(instance) != 0)
                {
                    LogError("Failed stopping device '%s'", instance->config->device_id);
                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
            }
        }
        else if (instance->state == DEVICE_STATE_STARTING)
        {
            if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS)
            {
                if (instance->auth_state == AUTHENTICATION_STATE_STOPPED)
                {
                    if (authentication_start(instance->authentication_handle, instance->cbs_handle) != RESULT_OK)
                    {
                        LogError("Device '%s' failed to be authenticated (authentication_start failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                }
                else if (instance->auth_state == AUTHENTICATION_STATE_STARTING)
                {
                    int is_timed_out;
                    if (is_timeout_reached(instance->auth_state_last_changed_time, instance->auth_state_change_timeout_secs, &is_timed_out) != RESULT_OK)
                    {
                        LogError("Device '%s' failed verifying the timeout for authentication start (is_timeout_reached failed)", instance->config->device_id);
                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                    else if (is_timed_out == 1)
                    {
                        LogError("Device '%s' authentication did not complete starting within expected timeout (%lu)", instance->config->device_id, (unsigned long)instance->auth_state_change_timeout_secs);

                        update_state(instance, DEVICE_STATE_ERROR_AUTH_TIMEOUT);
                    }
                }
                else if (instance->auth_state == AUTHENTICATION_STATE_ERROR)
                {
                    if (instance->auth_error_code == AUTHENTICATION_ERROR_AUTH_FAILED)
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                    else // DEVICE_STATE_ERROR_TIMEOUT
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH_TIMEOUT);
                    }
                }
                // There is no AUTHENTICATION_STATE_STOPPING
            }

            if (instance->config->authentication_mode == DEVICE_AUTH_MODE_X509 || instance->auth_state == AUTHENTICATION_STATE_STARTED)
            {
                size_t number_of_messengers_started = 0;

                if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STOPPED)
                {
                    if (telemetry_messenger_start(instance->messenger_handle, instance->session_handle) != RESULT_OK)
                    {
                        LogError("Device '%s' messenger failed to be started (messenger_start failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STARTING)
                {
                    int is_timed_out;
                    if (is_timeout_reached(instance->msgr_state_last_changed_time, instance->msgr_state_change_timeout_secs, &is_timed_out) != RESULT_OK)
                    {
                        LogError("Device '%s' failed verifying the timeout for messenger start (is_timeout_reached failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                    else if (is_timed_out == 1)
                    {
                        LogError("Device '%s' messenger did not complete starting within expected timeout (%lu)", instance->config->device_id, (unsigned long)instance->msgr_state_change_timeout_secs);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_ERROR)
                {
                    LogError("Device '%s' messenger failed to be started (messenger got into error state)", instance->config->device_id);

                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
                else if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STARTED)
                {
                    number_of_messengers_started++;
                }

                if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STOPPED)
                {
                    if (twin_messenger_start(instance->twin_messenger_handle, instance->session_handle) != RESULT_OK)
                    {
                        LogError("Device '%s' twin messenger failed to be started (messenger_start failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STARTING)
                {
                    int is_timed_out;
                    if (is_timeout_reached(instance->twin_msgr_state_last_changed_time, instance->twin_msgr_state_change_timeout_secs, &is_timed_out) != RESULT_OK)
                    {
                        LogError("Device '%s' failed verifying the timeout for twin messenger start (is_timeout_reached failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                    else if (is_timed_out == 1)
                    {
                        LogError("Device '%s' twin messenger did not complete starting within expected timeout (%lu)", instance->config->device_id, (unsigned long)instance->twin_msgr_state_change_timeout_secs);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_ERROR)
                {
                    LogError("Device '%s' twin messenger failed to be started (messenger got into error state)", instance->config->device_id);

                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
                else if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STARTED)
                {
                    number_of_messengers_started++;
                }

                if (number_of_messengers_started == 2)
                {
                    update_state(instance, DEVICE_STATE_STARTED);
                }
            }
        }
        else if (instance->state == DEVICE_STATE_STARTED)
        {
            if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS &&
                instance->auth_state != AUTHENTICATION_STATE_STARTED)
            {
                LogError("Device '%s' is started but authentication reported unexpected state %d", instance->config->device_id, instance->auth_state);

                if (instance->auth_state != AUTHENTICATION_STATE_ERROR)
                {
                    if (instance->auth_error_code == AUTHENTICATION_ERROR_AUTH_FAILED)
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                    else // AUTHENTICATION_ERROR_AUTH_TIMEOUT
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH_TIMEOUT);
                    }
                }
                else
                {
                    update_state(instance, DEVICE_STATE_ERROR_AUTH);
                }
            }
            else
            {
                if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STARTED)
                {
                    LogError("Device '%s' is started but messenger reported unexpected state %d", instance->config->device_id, instance->msgr_state);
                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }

                if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STARTED)
                {
                    LogError("Device '%s' is started but TWIN messenger reported unexpected state %d", instance->config->device_id, instance->twin_msgr_state);
                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
            }
        }

        // Invoking the do_works():
        if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS)
        {
            if (instance->auth_state != AUTHENTICATION_STATE_STOPPED && instance->auth_state != AUTHENTICATION_STATE_ERROR)
            {
                authentication_do_work(instance->authentication_handle);
            }
        }

        if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPED && instance->msgr_state != TELEMETRY_MESSENGER_STATE_ERROR)
        {
            telemetry_messenger_do_work(instance->messenger_handle);
        }

        if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPED && instance->twin_msgr_state != TWIN_MESSENGER_STATE_ERROR)
        {
            twin_messenger_do_work(instance->twin_messenger_handle);
        }
    }
}